

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int hdr_log_read_header(hdr_log_reader *reader,FILE *file)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char line [128];
  double local_c8;
  hdr_timespec *local_c0;
  char local_b8 [136];
  
  local_c0 = &reader->start_timestamp;
  bVar1 = true;
  do {
    iVar2 = fgetc((FILE *)file);
    ungetc(iVar2,(FILE *)file);
    if (iVar2 == 0x22) {
      pcVar3 = fgets(local_b8,0x80,(FILE *)file);
      bVar4 = pcVar3 != (char *)0x0;
      if (bVar4) {
        bVar1 = false;
      }
    }
    else {
      if (iVar2 == 0x23) {
        pcVar3 = fgets(local_b8,0x80,(FILE *)file);
        if (pcVar3 == (char *)0x0) {
          bVar4 = false;
          goto LAB_00105d4a;
        }
        __isoc99_sscanf(local_b8,"#[Histogram log format version %d.%d]",reader);
        local_c8 = 0.0;
        iVar2 = __isoc99_sscanf(local_b8,"#[StartTime: %lf [^\n]",&local_c8);
        if (iVar2 == 1) {
          hdr_timespec_from_double(local_c0,local_c8);
        }
      }
      else {
        bVar1 = false;
      }
      bVar4 = true;
    }
LAB_00105d4a:
    if (!bVar4) {
      return 5;
    }
    if (!bVar1) {
      iVar2 = -0x7529;
      if ((reader->major_version == 1) && (iVar2 = -0x7529, (uint)reader->minor_version < 4)) {
        iVar2 = 0;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

int hdr_log_read_header(struct hdr_log_reader* reader, FILE* file)
{
    char line[HEADER_LINE_LENGTH]; /* TODO: check for overflow. */

    bool parsing_header = true;

    do
    {
        int c = fgetc(file);
        ungetc(c, file);

        switch (c)
        {

        case '#':
            if (fgets(line, HEADER_LINE_LENGTH, file) == NULL)
            {
                return EIO;
            }

            scan_header_line(reader, line);
            break;

        case '"':
            if (fgets(line, HEADER_LINE_LENGTH, file) == NULL)
            {
                return EIO;
            }

            parsing_header = false;
            break;

        default:
            parsing_header = false;
        }
    }
    while (parsing_header);

    if (!validate_log_version(reader))
    {
        return HDR_LOG_INVALID_VERSION;
    }

    return 0;
}